

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O1

uint8_t * __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getBCD
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,int8_t *sign,
          int32_t *exponent,ValueLength *mantissaLength)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  long lVar4;
  uint8_t *extraout_RAX;
  ulong uVar5;
  ValueLength VVar6;
  byte bVar7;
  ulong uVar8;
  byte *pbVar9;
  bool bVar10;
  
  bVar7 = **(byte **)this;
  if (0xf < (ulong)bVar7 - 200) {
    SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::getBCD();
    return extraout_RAX;
  }
  bVar10 = (bVar7 & 0xf8) == 200;
  lVar4 = ((ulong)bVar10 << 3 | 0xffffffffffffff31) + (ulong)bVar7;
  *sign = -!bVar10 | 1;
  pbVar3 = *(byte **)this;
  bVar7 = 0;
  pbVar9 = pbVar3;
  do {
    bVar1 = *pbVar9;
    if ((bVar1 & 0xfe) != 0xee) break;
    uVar2 = (uint)(bVar1 == 0xef) * 9;
    if (bVar1 == 0xee) {
      uVar2 = 2;
    }
    bVar7 = bVar7 + (char)uVar2;
    pbVar9 = pbVar9 + uVar2;
  } while (uVar2 != 0);
  *exponent = *(int32_t *)(pbVar3 + lVar4 + 1 + (ulong)bVar7);
  bVar7 = 0;
  pbVar9 = pbVar3;
  do {
    bVar1 = *pbVar9;
    if ((bVar1 & 0xfe) != 0xee) break;
    uVar2 = (uint)(bVar1 == 0xef) * 9;
    if (bVar1 == 0xee) {
      uVar2 = 2;
    }
    bVar7 = bVar7 + (char)uVar2;
    pbVar9 = pbVar9 + uVar2;
  } while (uVar2 != 0);
  if (7 < lVar4 - 1U) {
    VVar6 = 0;
    goto LAB_0010dea2;
  }
  uVar5 = (ulong)bVar7;
  switch(lVar4) {
  case 1:
    VVar6 = (ValueLength)pbVar3[uVar5 + 1];
    break;
  case 2:
    VVar6 = (ValueLength)*(ushort *)(pbVar3 + uVar5 + 1);
    break;
  case 3:
    uVar8 = (ulong)((uint)pbVar3[uVar5 + 2] << 8 | (uint)pbVar3[uVar5 + 3] << 0x10);
    uVar5 = (ulong)pbVar3[uVar5 + 1];
    goto LAB_0010de9b;
  case 4:
    VVar6 = (ValueLength)*(uint *)(pbVar3 + uVar5 + 1);
    break;
  case 5:
    uVar2 = *(uint *)(pbVar3 + uVar5 + 1);
    uVar5 = (ulong)pbVar3[uVar5 + 5];
    goto LAB_0010de78;
  case 6:
    uVar2 = *(uint *)(pbVar3 + uVar5 + 1);
    uVar5 = (ulong)*(ushort *)(pbVar3 + uVar5 + 5);
LAB_0010de78:
    VVar6 = uVar5 << 0x20 | (ulong)uVar2;
    break;
  case 7:
    uVar8 = (ulong)CONCAT12(pbVar3[uVar5 + 7],*(undefined2 *)(pbVar3 + uVar5 + 5)) << 0x20;
    uVar5 = (ulong)*(uint *)(pbVar3 + uVar5 + 1);
LAB_0010de9b:
    VVar6 = uVar5 | uVar8;
    break;
  case 8:
    VVar6 = *(ValueLength *)(pbVar3 + uVar5 + 1);
  }
LAB_0010dea2:
  *mantissaLength = VVar6;
  bVar7 = 0;
  pbVar9 = pbVar3;
  do {
    bVar1 = *pbVar9;
    if ((bVar1 & 0xfe) != 0xee) break;
    uVar2 = (uint)(bVar1 == 0xef) * 9;
    if (bVar1 == 0xee) {
      uVar2 = 2;
    }
    bVar7 = bVar7 + (char)uVar2;
    pbVar9 = pbVar9 + uVar2;
  } while (uVar2 != 0);
  return pbVar3 + lVar4 + (ulong)bVar7 + 5;
}

Assistant:

uint8_t const* getBCD(int8_t& sign, int32_t& exponent,
                        ValueLength& mantissaLength) const {
    if (VELOCYPACK_UNLIKELY(!isBCD())) {
      throw Exception(Exception::InvalidValueType, "Expecting type BCD");
    }

    uint64_t type = head();
    bool positive = type >= 0xc8 && type <= 0xcf;
    uint64_t mlenlen = type - (positive ? 0xc7 : 0xcf);

    sign = positive ? 1 : -1;
    exponent = static_cast<int32_t>(
        readIntegerFixed<uint32_t, 4>(valueStart() + 1 + mlenlen));
    mantissaLength =
        readIntegerNonEmpty<ValueLength>(valueStart() + 1, mlenlen);

    return valueStart() + 1 + mlenlen + 4;
  }